

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

void __thiscall OpenSteer::Camera::mouseAdjustOffset(Camera *this,Vec3 *adjustment)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  AbstractVehicle *pAVar10;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  float fVar11;
  Vec3 VVar12;
  Vec3 local_48;
  undefined8 local_38;
  float local_30;
  undefined1 local_28 [16];
  
  if (this->mode - cmFixed < 5) {
    pAVar10 = this->vehicleToTrack;
    switch(this->mode) {
    case cmFixed:
      uVar1 = (this->fixedPosition).x;
      uVar6 = (this->fixedPosition).y;
      uVar2 = (this->fixedTarget).x;
      uVar7 = (this->fixedTarget).y;
      local_48.z = (this->fixedPosition).z - (this->fixedTarget).z;
      local_48.y = (float)uVar6 - (float)uVar7;
      local_48.x = (float)uVar1 - (float)uVar2;
      VVar12 = mouseAdjust2(this,true,adjustment,&local_48);
      fVar11 = (this->fixedTarget).z;
      uVar3 = (this->fixedTarget).x;
      uVar8 = (this->fixedTarget).y;
      (this->fixedPosition).x = (float)uVar3 + VVar12.x;
      (this->fixedPosition).y = (float)uVar8 + VVar12.y;
      (this->fixedPosition).z = VVar12.z + fVar11;
      break;
    case cmStraightDown:
      local_48.z = this->lookdownDistance;
      local_48.x = 0.0;
      local_48.y = 0.0;
      VVar12 = mouseAdjust2(this,true,adjustment,&local_48);
      this->lookdownDistance = VVar12.z;
      break;
    case cmFixedDistanceOffset:
      (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
      uVar4 = (this->target).x;
      uVar9 = (this->target).y;
      local_48.z = in_XMM1_Da - (this->target).z;
      local_48.y = extraout_XMM0_Db_00 - (float)uVar9;
      local_48.x = extraout_XMM0_Da_00 - (float)uVar4;
      VVar12 = mouseAdjust2(this,true,adjustment,&local_48);
      fVar11 = VVar12.z;
      local_28._8_4_ = extraout_XMM0_Dc;
      local_28._0_8_ = VVar12._0_8_;
      local_28._12_4_ = extraout_XMM0_Dd;
      uVar5 = (this->target).x;
      (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
                ((float)uVar5 + VVar12.x,(ulong)(uint)((this->target).z + fVar11),this);
      this->fixedDistDistance =
           SQRT(fVar11 * fVar11 +
                (float)local_28._0_4_ * (float)local_28._0_4_ +
                (float)local_28._4_4_ * (float)local_28._4_4_);
      (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
      this->fixedDistVOffset = extraout_XMM0_Db_01 - (this->target).y;
      break;
    case cmFixedLocalOffset:
      (*(pAVar10->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xf])
                (pAVar10,&this->fixedLocalOffset);
      VVar12 = mouseAdjust2(this,true,adjustment,&local_48);
      local_30 = VVar12.z;
      local_38 = VVar12._0_8_;
      (*(pAVar10->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xc])(pAVar10);
      (this->fixedLocalOffset).x = (float)extraout_XMM0_Da_01;
      (this->fixedLocalOffset).y = (float)extraout_XMM0_Db_02;
      (this->fixedLocalOffset).z = local_30;
      break;
    case cmOffsetPOV:
      (*(pAVar10->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xf])(pAVar10);
      VVar12 = mouseAdjust2(this,false,adjustment,&local_48);
      local_30 = VVar12.z;
      local_38 = VVar12._0_8_;
      (*(pAVar10->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0xc])(pAVar10);
      (this->povOffset).x = (float)extraout_XMM0_Da;
      (this->povOffset).y = (float)extraout_XMM0_Db;
      (this->povOffset).z = local_30;
    }
  }
  return;
}

Assistant:

void 
OpenSteer::Camera::mouseAdjustOffset (const Vec3& adjustment)
{
    // vehicle being tracked (just a reference with a more concise name)
    const AbstractVehicle& v = *vehicleToTrack;

    switch (mode)
    {
    case cmFixed:
        {
            const Vec3 offset = fixedPosition - fixedTarget;
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            fixedPosition = fixedTarget + adjusted;
            break;
        }
    case cmFixedDistanceOffset:
        {
            // XXX this is the oddball case, adjusting "position" instead
            // XXX of mode parameters, hence no smoothing during adjustment
            // XXX Plus the fixedDistVOffset feature complicates things
            const Vec3 offset = position() - target;
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            // XXX --------------------------------------------------
//             position = target + adjusted;
//             fixedDistDistance = adjusted.length();
//             fixedDistVOffset = position.y - target.y;
            // XXX --------------------------------------------------
//             const float s = smoothMoveSpeed * (1.0f/40f);
//             const Vec3 newPosition = target + adjusted;
//             position = interpolate (s, position, newPosition);
//             fixedDistDistance = interpolate (s, fixedDistDistance, adjusted.length());
//             fixedDistVOffset = interpolate (s, fixedDistVOffset, position.y - target.y);
            // XXX --------------------------------------------------
//          position = target + adjusted;
            setPosition (target + adjusted);
            fixedDistDistance = adjusted.length();
//          fixedDistVOffset = position.y - target.y;
            fixedDistVOffset = position().y - target.y;
            // XXX --------------------------------------------------
            break;
        }
    case cmStraightDown:
        {
            const Vec3 offset (0, 0, lookdownDistance);
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            lookdownDistance = adjusted.z;
            break;
        }
    case cmFixedLocalOffset:
        {
            const Vec3 offset = v.globalizeDirection (fixedLocalOffset);
            const Vec3 adjusted = mouseAdjustPolar (adjustment, offset);
            fixedLocalOffset = v.localizeDirection (adjusted);
            break;
        }
    case cmOffsetPOV:
        {
            // XXX this might work better as a translation control, it is
            // XXX non-obvious using a polar adjustment when the view
            // XXX center is not at the camera aim target
            const Vec3 offset = v.globalizeDirection (povOffset);
            const Vec3 adjusted = mouseAdjustOrtho (adjustment, offset);
            povOffset = v.localizeDirection (adjusted);
            break;
        }
    default:
        break;
    }
}